

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_array.cpp
# Opt level: O0

void __thiscall
SparseArray_InitializerListIndicesHasIndex_Test<unsigned_short>::
SparseArray_InitializerListIndicesHasIndex_Test
          (SparseArray_InitializerListIndicesHasIndex_Test<unsigned_short> *this)

{
  SparseArray_InitializerListIndicesHasIndex_Test<unsigned_short> *this_local;
  
  anon_unknown.dwarf_92f3e::SparseArray<unsigned_short>::SparseArray
            (&this->super_SparseArray<unsigned_short>);
  (this->super_SparseArray<unsigned_short>).super_Test._vptr_Test =
       (_func_int **)&PTR__SparseArray_InitializerListIndicesHasIndex_Test_00351378;
  return;
}

Assistant:

TYPED_TEST (SparseArray, InitializerListIndicesHasIndex) {
    auto arrp = sparse_array<with_default_ctor, TypeParam>::make_unique ({0, 2, 4});
    auto & arr = *arrp;

    std::array<bool, 256> indices{{true, false, true, false, true}};

    for (auto ctr = 0U; ctr < indices.size (); ++ctr) {
        EXPECT_EQ (arr.has_index (ctr), indices[ctr]);
    }
    EXPECT_EQ (arr[0].a, 37);
    EXPECT_EQ (arr[2].a, 37);
    EXPECT_EQ (arr[4].a, 37);
}